

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_construct.cpp
# Opt level: O3

void __thiscall tst_qpromise_construct::connectAndResolve(tst_qpromise_construct *this)

{
  QSharedData *pQVar1;
  _Atomic_word *p_Var2;
  int iVar3;
  QSharedData *pQVar4;
  _Manager_type p_Var5;
  weak_ptr<int> *pwVar6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data> QVar7
  ;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data> QVar8
  ;
  PromiseResolver<std::shared_ptr<int>_> PVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  QObject *this_00;
  PromiseData<std::shared_ptr<int>_> *this_01;
  undefined4 *puVar13;
  char *pcVar14;
  char *pcVar15;
  PromiseDataBase<void,_void_()> *this_02;
  element_type *peVar16;
  QObject *oldD;
  QSharedData *pQVar17;
  Data *pDVar18;
  char *reject;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_03;
  QByteArrayView QVar19;
  Data *local_138;
  Data *pDStack_130;
  element_type **local_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_120;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_118;
  PromiseResolver<void> resolver_1;
  _Any_data local_108;
  _Manager_type local_f8;
  _Invoker_type p_Stack_f0;
  QPromise<void> local_e0;
  weak_ptr<int> *local_d0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
  local_c8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
  QStack_c0;
  PromiseResolver<std::shared_ptr<int>_> resolver;
  weak_ptr<int> wptr;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  QObject local_48 [8];
  code *local_40;
  undefined8 local_38;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (PromiseData<std::shared_ptr<int>_> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    super_QSharedData = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.ptr)->d =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.ptr)->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    m_lock = 0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
    m_settled = 0;
  *(undefined8 *)
   &((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value
    )->super_QSharedData = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00126c90;
  QReadWriteLock::QReadWriteLock
            (&(this_01->
              super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
              m_lock,0);
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_settled = false;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.ptr)->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_handlers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.ptr)->d =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
     m_catchers.d.size)->d = 0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  m_error.m_data = (exception_ptr)0x0;
  (this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
  _vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00126c28;
  ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)&this_01->m_value
    )->super_QSharedData = 0;
  LOCK();
  pQVar4 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + 1);
  UNLOCK();
  LOCK();
  pQVar4 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + 1);
  UNLOCK();
  pQVar4 = &(this_01->
            super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
            super_QSharedData;
  local_108._M_unused._M_object = &PTR__QPromiseBase_00126bf0;
  local_108._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::PromiseResolver
            (&resolver,(QPromise<std::shared_ptr<int>_> *)&local_108);
  local_108._M_unused._M_object = &PTR__QPromiseBase_001268b8;
  if ((PromiseData<std::shared_ptr<int>_> *)local_108._8_8_ !=
      (PromiseData<std::shared_ptr<int>_> *)0x0) {
    LOCK();
    pQVar17 = (QSharedData *)(local_108._8_8_ + 8);
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<std::shared_ptr<int>_> *)local_108._8_8_ !=
        (PromiseData<std::shared_ptr<int>_> *)0x0)) {
      (**(code **)(*(long *)local_108._8_8_ + 8))();
    }
  }
  PVar9.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_c8.d = (Data *)0x0;
LAB_0010c00d:
    QStack_c0.d = (Data *)0x0;
    bVar10 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_c8 = resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_0010c00d;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_c8 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    QStack_c0 = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar10 = false;
  }
  QVar8.d = QStack_c0.d;
  QVar7.d = local_c8.d;
  local_d0 = &wptr;
  pwVar6 = local_d0;
  if (local_c8.d != (Data *)0x0) {
    LOCK();
    ((local_c8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_c8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (QStack_c0.d != (Data *)0x0) {
    LOCK();
    ((QStack_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QStack_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40 = QObject::objectNameChanged;
  local_38 = 0;
  puVar13 = (undefined4 *)operator_new(0x28);
  if (QVar7.d != (Data *)0x0) {
    LOCK();
    ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (QVar8.d != (Data *)0x0) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *puVar13 = 1;
  *(code **)(puVar13 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp:288:25),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(weak_ptr<int> **)(puVar13 + 4) = pwVar6;
  *(Data **)(puVar13 + 6) = QVar7.d;
  if (QVar7.d != (Data *)0x0) {
    LOCK();
    ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)(puVar13 + 8) = QVar8.d;
  if (QVar8.d != (Data *)0x0) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QObject::connectImpl
            (local_48,(void **)this_00,(QObject *)&local_40,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar13,(int *)((long)&iRam0000000000000000 + 1),(QMetaObject *)0x0);
  if (QVar8.d != (Data *)0x0) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar8.d,0x10);
    }
  }
  if (QVar7.d != (Data *)0x0) {
    LOCK();
    ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar7.d,0x10);
    }
  }
  if (QVar8.d != (Data *)0x0) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar8.d,0x10);
    }
  }
  if (QVar7.d != (Data *)0x0) {
    LOCK();
    ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar7.d,0x10);
    }
  }
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (QStack_c0.d != (Data *)0x0) {
    LOCK();
    ((QStack_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QStack_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QStack_c0.d,0x10);
    }
  }
  if (local_c8.d != (Data *)0x0) {
    LOCK();
    ((local_c8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_c8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_c8.d,0x10);
    }
  }
  if (!bVar10) {
    LOCK();
    ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar8.d,0x10);
    }
  }
  if (PVar9.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar9.m_d.d = *(int *)PVar9.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar9.m_d.d == 0) {
      operator_delete((void *)PVar9.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar10 = QtPromisePrivate::
           PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::isPending
                     ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)
                      this_01);
  local_108._M_pod_data[0] = bVar10;
  resolver.m_d.d._0_1_ = 1;
  pcVar14 = QTest::toString<bool>((bool *)local_108._M_pod_data);
  pcVar15 = QTest::toString<bool>((bool *)&resolver);
  reject = "p.isPending()";
  cVar11 = QTest::compare_helper
                     (bVar10,"Compared values are not the same",pcVar14,pcVar15,"p.isPending()",
                      "true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                      ,0x12d);
  if (cVar11 != '\0') {
    QVar19.m_data = (storage_type *)0x6;
    QVar19.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar19);
    p_Var5 = local_f8;
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
          )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::shared_ptr<int>_>::Data>
            )local_108._M_unused._0_8_;
    QObject::setObjectName((QString *)this_00);
    if (resolver.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver.m_d.d == 0) {
        QArrayData::deallocate((QArrayData *)resolver.m_d.d,2,8);
      }
    }
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
    this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
    *(undefined8 *)&this_02->super_QSharedData = 0;
    (this_02->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_02->m_catchers).d.size = 0;
    (this_02->m_handlers).d.size = 0;
    (this_02->m_catchers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0
    ;
    *(undefined8 *)&this_02->m_lock = 0;
    *(undefined8 *)&this_02->m_settled = 0;
    (this_02->m_error).m_data._M_exception_object = (void *)0x0;
    this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00126af8;
    QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
    this_02->m_settled = false;
    (this_02->m_handlers).d.d = (Data *)0x0;
    (this_02->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0
    ;
    (this_02->m_handlers).d.size = 0;
    (this_02->m_catchers).d.d = (Data *)0x0;
    (this_02->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_02->m_catchers).d.size = 0;
    (this_02->m_error).m_data._M_exception_object = (void *)0x0;
    this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00126a90;
    LOCK();
    (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar17 = &this_02->super_QSharedData;
    local_e0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a58
    ;
    local_e0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_02;
    QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_e0);
    local_e0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126888
    ;
    if (&(local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0) {
      LOCK();
      pQVar1 = &((local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (&(local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
          (PromiseDataBase<void,_void_()> *)0x0)) {
        (*((local_e0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
          _vptr_PromiseDataBase[1])();
      }
    }
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_118.d = (Data *)0x0;
      local_120.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_118 = resolver_1.m_d.d;
      if (resolver_1.m_d.d == (Data *)0x0) {
        local_120.d = (Data *)0x0;
LAB_0010c47c:
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
        if (local_120.d == (Data *)0x0) goto LAB_0010c491;
      }
      else {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
        local_120 = resolver_1.m_d.d;
        if (resolver_1.m_d.d != (Data *)0x0) goto LAB_0010c47c;
      }
      LOCK();
      ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
LAB_0010c491:
    local_128 = &local_58;
    local_108._M_unused._M_object = (_func_int **)0x0;
    local_108._8_8_ = (PromiseData<std::shared_ptr<int>_> *)0x0;
    local_f8 = (_Manager_type)0x0;
    p_Stack_f0 = (_Invoker_type)0x0;
    local_138 = local_118.d;
    pDStack_130 = local_120.d;
    local_108._M_unused._M_object = operator_new(0x18);
    *(Data **)local_108._M_unused._0_8_ = local_138;
    if (local_138 != (Data *)0x0) {
      LOCK();
      (local_138->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_138->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ((Data *)local_108._M_unused._0_8_)->promise = (QPromise<std::shared_ptr<int>_> *)pDStack_130;
    if (pDStack_130 == (Data *)0x0) {
      *(element_type ***)((long)local_108._M_unused._0_8_ + 0x10) = local_128;
      p_Stack_f0 = std::
                   _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
    }
    else {
      LOCK();
      (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      *(element_type ***)((long)local_108._M_unused._0_8_ + 0x10) = local_128;
      p_Stack_f0 = std::
                   _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(const_std::shared_ptr<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
      if (pDStack_130 != (Data *)0x0) {
        LOCK();
        (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDStack_130->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(pDStack_130,0x10);
        }
      }
    }
    if (local_138 != (Data *)0x0) {
      LOCK();
      (local_138->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_138->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_138->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_138,0x10);
      }
    }
    QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    addHandler((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)this_01
               ,(function<void_(const_std::shared_ptr<int>_&)> *)&local_108);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
    QtPromisePrivate::PromiseCatcher<std::shared_ptr<int>,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
               (PromiseCatcher<std::shared_ptr<int>,decltype(nullptr),void> *)0x0,&local_118,
               (QPromiseResolve<void> *)&local_120,(QPromiseReject<void> *)reject);
    QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
    addCatcher((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)this_01
               ,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
    if (p_Var5 != (_Manager_type)0x0) {
      (*p_Var5)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
    }
    if (local_120.d != (Data *)0x0) {
      LOCK();
      ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        operator_delete(local_120.d,0x10);
      }
    }
    if (local_118.d != (Data *)0x0) {
      LOCK();
      ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_118.d,0x10);
      }
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver_1.m_d.d == 0) {
        operator_delete((void *)resolver_1.m_d.d,0x10);
      }
    }
    bVar10 = QtPromisePrivate::
             PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::isPending
                       ((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>
                         *)this_01);
    if (!bVar10) {
      QtPromisePrivate::PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>::
      dispatch((PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)> *)this_01
              );
    }
    bVar10 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
    while (bVar10 != false) {
      QCoreApplication::processEvents();
      QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      bVar10 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
    }
    LOCK();
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*this_02->_vptr_PromiseDataBase[1])(this_02);
    }
    LOCK();
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*this_02->_vptr_PromiseDataBase[1])(this_02);
    }
    if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0010c6b7:
      peVar16 = (element_type *)0x0;
    }
    else {
      iVar12 = (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count;
      do {
        if (iVar12 == 0) {
          peVar16 = (element_type *)0x0;
          this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_0010c6be;
        }
        LOCK();
        iVar3 = (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count;
        bVar10 = iVar12 == iVar3;
        if (bVar10) {
          (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
               iVar12 + 1;
          iVar3 = iVar12;
        }
        iVar12 = iVar3;
        UNLOCK();
      } while (!bVar10);
      peVar16 = wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_03._M_pi = wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
          == 0) goto LAB_0010c6b7;
    }
LAB_0010c6be:
    cVar11 = QTest::compare_helper
                       (local_58 == peVar16,"Compared values are not the same",(char *)0x0,
                        (char *)0x0,"waitForValue(p, std::shared_ptr<int>{})","wptr.lock()",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                        ,0x131);
    if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
    }
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
    if (cVar11 != '\0') {
      if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pDVar18 = (Data *)0x0;
      }
      else {
        pDVar18 = (Data *)(long)(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                _M_pi)->_M_use_count;
      }
      local_e0.super_QPromiseBase<void>._vptr_QPromiseBase =
           (_func_int **)((long)&iRam0000000000000000 + 1);
      local_138 = pDVar18;
      pcVar14 = QTest::toString<long>((long *)&local_138);
      pcVar15 = QTest::toString<long>((long *)&local_e0);
      cVar11 = QTest::compare_helper
                         (pDVar18 == (Data *)((long)&iRam0000000000000000 + 1),
                          "Compared values are not the same",pcVar14,pcVar15,"wptr.use_count()","1l"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                          ,0x132);
      LOCK();
      pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + -1);
      UNLOCK();
      if (((QAtomicInteger<int>)pQVar4->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0)
      {
        (*(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>
          )._vptr_PromiseDataBase[1])(this_01);
      }
      if (cVar11 != '\0') {
        if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pDVar18 = (Data *)0x0;
        }
        else {
          pDVar18 = (Data *)(long)(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_M_use_count;
        }
        local_e0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
        local_138 = pDVar18;
        pcVar14 = QTest::toString<long>((long *)&local_138);
        pcVar15 = QTest::toString<long>((long *)&local_e0);
        QTest::compare_helper
                  (pDVar18 == (Data *)0x0,"Compared values are not the same",pcVar14,pcVar15,
                   "wptr.use_count()","0l",
                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                   ,0x135);
      }
      goto LAB_0010c829;
    }
  }
  LOCK();
  pQVar4->ref = (QAtomicInt)((int)pQVar4->ref + -1);
  UNLOCK();
  if (((QAtomicInteger<int>)pQVar4->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0) {
    (*(this_01->super_PromiseDataBase<std::shared_ptr<int>,_void_(const_std::shared_ptr<int>_&)>).
      _vptr_PromiseDataBase[1])(this_01);
  }
LAB_0010c829:
  if (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar12 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar12 = (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_weak_count;
      (wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
           iVar12 + -1;
    }
    if (iVar12 == 1) {
      (*(wptr.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  (**(code **)(*(long *)this_00 + 0x20))(this_00);
  return;
}

Assistant:

void tst_qpromise_construct::connectAndResolve()
{
    QScopedPointer<QObject> object(new QObject{});

    std::weak_ptr<int> wptr;

    {
        auto p = QtPromise::QPromise<std::shared_ptr<int>>{
            [&](const QtPromise::QPromiseResolve<std::shared_ptr<int>>& resolve,
                const QtPromise::QPromiseReject<std::shared_ptr<int>>& reject) {
                connect(object.data(),
                        &QObject::objectNameChanged,
                        [=, &wptr](const QString& name) {
                            auto sptr = std::make_shared<int>(42);

                            wptr = sptr;

                            if (name == "foobar") {
                                resolve(sptr);
                            } else {
                                reject(42);
                            }
                        });
            }};

        QCOMPARE(p.isPending(), true);

        object->setObjectName("foobar");

        QCOMPARE(waitForValue(p, std::shared_ptr<int>{}), wptr.lock());
        QCOMPARE(wptr.use_count(), 1l); // "p" still holds a reference
    }

    QCOMPARE(wptr.use_count(), 0l);
}